

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2melody.cpp
# Opt level: O0

int notecompare(void *a,void *b)

{
  Melody *bb;
  Melody *aa;
  void *b_local;
  void *a_local;
  
  if (*b <= *a) {
    if (*a < *b || *a == *b) {
      if (*(int *)((long)b + 0x10) < *(int *)((long)a + 0x10)) {
        a_local._4_4_ = 1;
      }
      else if (*(int *)((long)a + 0x10) < *(int *)((long)b + 0x10)) {
        a_local._4_4_ = -1;
      }
      else {
        a_local._4_4_ = 0;
      }
    }
    else {
      a_local._4_4_ = 1;
    }
  }
  else {
    a_local._4_4_ = -1;
  }
  return a_local._4_4_;
}

Assistant:

int notecompare(const void* a, const void* b) {
	const Melody& aa = *static_cast<const Melody*>(a);
	const Melody& bb = *static_cast<const Melody*>(b);

	if (aa.tick < bb.tick) {
		return -1;
	} else if (aa.tick > bb.tick) {
		return 1;
	} else {
		// highest note comes first
		if (aa.pitch > bb.pitch) {
			return 1;
		} else if (aa.pitch < bb.pitch) {
			return -1;
		} else {
			return 0;
		}
	}
}